

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O2

void bn_mul_normal(unsigned_long *r,unsigned_long *a,int na,unsigned_long *b,int nb)

{
  ulong *puVar1;
  unsigned_long *ap;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  
  ap = a;
  uVar3 = nb;
  if (na < nb) {
    ap = b;
    b = a;
    uVar3 = na;
    na = nb;
  }
  if ((int)uVar3 < 1) {
    bn_mul_words(r,ap,na,0);
    return;
  }
  uVar2 = bn_mul_words(r,ap,na,*b);
  puVar1 = r + na;
  *puVar1 = uVar2;
  lVar4 = 0;
  while( true ) {
    if (uVar3 < 2) {
      return;
    }
    uVar2 = bn_mul_add_words((ulong *)((long)r + lVar4 + 8),ap,na,*(ulong *)((long)b + lVar4 + 8));
    *(ulong *)((long)puVar1 + lVar4 + 8) = uVar2;
    if (uVar3 == 2) {
      return;
    }
    uVar2 = bn_mul_add_words((ulong *)((long)r + lVar4 + 0x10),ap,na,
                             *(ulong *)((long)b + lVar4 + 0x10));
    *(ulong *)((long)puVar1 + lVar4 + 0x10) = uVar2;
    if (uVar3 < 4) {
      return;
    }
    uVar2 = bn_mul_add_words((ulong *)((long)r + lVar4 + 0x18),ap,na,
                             *(ulong *)((long)b + lVar4 + 0x18));
    *(ulong *)((long)puVar1 + lVar4 + 0x18) = uVar2;
    if (uVar3 == 4) break;
    uVar2 = bn_mul_add_words((ulong *)((long)r + lVar4 + 0x20),ap,na,
                             *(ulong *)((long)b + lVar4 + 0x20));
    *(ulong *)((long)puVar1 + lVar4 + 0x20) = uVar2;
    lVar4 = lVar4 + 0x20;
    uVar3 = uVar3 - 4;
  }
  return;
}

Assistant:

void bn_mul_normal(BN_ULONG *r, BN_ULONG *a, int na, BN_ULONG *b, int nb)
{
    BN_ULONG *rr;

    if (na < nb) {
        int itmp;
        BN_ULONG *ltmp;

        itmp = na;
        na = nb;
        nb = itmp;
        ltmp = a;
        a = b;
        b = ltmp;

    }
    rr = &(r[na]);
    if (nb <= 0) {
        (void)bn_mul_words(r, a, na, 0);
        return;
    } else
        rr[0] = bn_mul_words(r, a, na, b[0]);

    for (;;) {
        if (--nb <= 0)
            return;
        rr[1] = bn_mul_add_words(&(r[1]), a, na, b[1]);
        if (--nb <= 0)
            return;
        rr[2] = bn_mul_add_words(&(r[2]), a, na, b[2]);
        if (--nb <= 0)
            return;
        rr[3] = bn_mul_add_words(&(r[3]), a, na, b[3]);
        if (--nb <= 0)
            return;
        rr[4] = bn_mul_add_words(&(r[4]), a, na, b[4]);
        rr += 4;
        r += 4;
        b += 4;
    }
}